

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cc
# Opt level: O0

bool __thiscall
absl::str_format_internal::anon_unknown_53::ConvertStringArg
          (anon_unknown_53 *this,wchar_t *v,size_t len,FormatConversionSpecImpl conv,
          FormatSinkImpl *sink)

{
  wchar_t wc;
  FormatConversionSpecImpl conv_00;
  reference buf;
  pointer __str;
  string_view local_188;
  undefined4 local_174;
  size_t local_170;
  size_t chars;
  size_t i;
  size_t chars_written;
  undefined1 local_150 [5];
  ShiftState s;
  FixedArray<char,_18446744073709551615UL,_std::allocator<char>_> mb;
  FormatSinkImpl *sink_local;
  size_t len_local;
  wchar_t *v_local;
  FormatConversionSpecImpl conv_local;
  
  std::allocator<char>::allocator();
  FixedArray<char,_18446744073709551615UL,_std::allocator<char>_>::FixedArray
            ((FixedArray<char,_18446744073709551615UL,_std::allocator<char>_> *)local_150,
             (long)v << 2,(allocator_type *)((long)&chars_written + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&chars_written + 7));
  ShiftState::ShiftState((ShiftState *)((long)&chars_written + 5));
  i = 0;
  chars = 0;
  do {
    if (v <= chars) {
      __str = FixedArray<char,_18446744073709551615UL,_std::allocator<char>_>::data
                        ((FixedArray<char,_18446744073709551615UL,_std::allocator<char>_> *)
                         local_150);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_188,__str,i);
      conv_00.precision_ = conv._0_4_;
      conv_00._0_8_ = len;
      conv_local.width_._3_1_ =
           ConvertStringArg(local_188,conv_00,
                            (FormatSinkImpl *)
                            CONCAT44((int)((ulong)register0x00000080 >> 0x20),conv.precision_));
LAB_001e082f:
      local_174 = 1;
      FixedArray<char,_18446744073709551615UL,_std::allocator<char>_>::~FixedArray
                ((FixedArray<char,_18446744073709551615UL,_std::allocator<char>_> *)local_150);
      return conv_local.width_._3_1_;
    }
    wc = *(wchar_t *)(this + chars * 4);
    buf = FixedArray<char,_18446744073709551615UL,_std::allocator<char>_>::operator[]
                    ((FixedArray<char,_18446744073709551615UL,_std::allocator<char>_> *)local_150,i)
    ;
    local_170 = WideToUtf8(wc,buf,(ShiftState *)((long)&chars_written + 5));
    if (local_170 == 0xffffffffffffffff) {
      conv_local.width_._3_1_ = false;
      goto LAB_001e082f;
    }
    i = local_170 + i;
    chars = chars + 1;
  } while( true );
}

Assistant:

inline bool ConvertStringArg(const wchar_t *v,
                             size_t len,
                             const FormatConversionSpecImpl conv,
                             FormatSinkImpl *sink) {
  FixedArray<char> mb(len * 4);
  ShiftState s;
  size_t chars_written = 0;
  for (size_t i = 0; i < len; ++i) {
    const size_t chars = WideToUtf8(v[i], &mb[chars_written], s);
    if (chars == static_cast<size_t>(-1)) { return false; }
    chars_written += chars;
  }
  return ConvertStringArg(string_view(mb.data(), chars_written), conv, sink);
}